

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

int __thiscall
mp::internal::BinaryReader<mp::internal::IdentityConverter>::ReadUInt
          (BinaryReader<mp::internal::IdentityConverter> *this)

{
  int iVar1;
  int *piVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  (this->super_BinaryReaderBase).super_ReaderBase.token_ =
       (this->super_BinaryReaderBase).super_ReaderBase.ptr_;
  piVar2 = (int *)BinaryReaderBase::Read(&this->super_BinaryReaderBase,4);
  iVar1 = *piVar2;
  if (iVar1 < 0) {
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    local_20.field_1.values_ = (Value *)&local_38;
    BinaryReaderBase::ReportError(&this->super_BinaryReaderBase,(CStringRef)0x22893d,&local_20);
  }
  return iVar1;
}

Assistant:

int ReadUInt() {
    int value = ReadInt<int>();
    if (value < 0)
      ReportError("expected unsigned integer");
    return value;
  }